

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O3

void mzd_mul_v_s128_192_1024(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  uint w;
  int iVar1;
  uint i;
  int iVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 local_88 [64];
  undefined1 local_48 [64];
  
  iVar1 = 3;
  local_48 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_88 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  do {
    iVar2 = 0x40;
    do {
      auVar4 = vpbroadcastq_avx512vl();
      lVar3 = 0;
      do {
        auVar5 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar3),auVar4,
                                     *(undefined1 (*) [16])(local_88 + lVar3),0x6a);
        *(undefined1 (*) [16])(local_88 + lVar3) = auVar5;
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0x20);
      lVar3 = 0x20;
      do {
        auVar5 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar3),auVar4,
                                     *(undefined1 (*) [16])(local_88 + lVar3),0x6a);
        *(undefined1 (*) [16])(local_88 + lVar3) = auVar5;
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0x40);
      lVar3 = 0x40;
      do {
        auVar5 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar3),auVar4,
                                     *(undefined1 (*) [16])(local_88 + lVar3),0x6a);
        *(undefined1 (*) [16])(local_88 + lVar3) = auVar5;
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0x60);
      lVar3 = 0x60;
      do {
        auVar5 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar3),auVar4,
                                     *(undefined1 (*) [16])(local_88 + lVar3),0x6a);
        *(undefined1 (*) [16])(local_88 + lVar3) = auVar5;
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0x80);
      A = A + 4;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  c->w64[0] = local_88._0_8_;
  c->w64[1] = local_88._8_8_;
  c->w64[2] = local_88._16_8_;
  c->w64[3] = local_88._24_8_;
  c[1].w64[0] = local_88._32_8_;
  c[1].w64[1] = local_88._40_8_;
  c[1].w64[2] = local_88._48_8_;
  c[1].w64[3] = local_88._56_8_;
  c[2].w64[0] = local_48._0_8_;
  c[2].w64[1] = local_48._8_8_;
  c[2].w64[2] = local_48._16_8_;
  c[2].w64[3] = local_48._24_8_;
  c[3].w64[0] = local_48._32_8_;
  c[3].w64[1] = local_48._40_8_;
  c[3].w64[2] = local_48._48_8_;
  c[3].w64[3] = local_48._56_8_;
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_mul_v_s128_192_1024(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word128 cval[8] = {mm128_zero, mm128_zero, mm128_zero, mm128_zero,
                     mm128_zero, mm128_zero, mm128_zero, mm128_zero};
  for (unsigned int w = 3; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 1, idx >>= 1, Ablock += 4) {
      const word128 mask = mm128_compute_mask(idx, 0);
      mm128_xor_mask_region(&cval[0], Ablock[0].w64, mask, 2);
      mm128_xor_mask_region(&cval[2], Ablock[1].w64, mask, 2);
      mm128_xor_mask_region(&cval[4], Ablock[2].w64, mask, 2);
      mm128_xor_mask_region(&cval[6], Ablock[3].w64, mask, 2);
    }
  }

  block_t* cblock1 = BLOCK(c, 0);
  block_t* cblock2 = BLOCK(c, 1);
  block_t* cblock3 = BLOCK(c, 2);
  block_t* cblock4 = BLOCK(c, 3);
  mm128_store(&cblock1->w64[0], cval[0]);
  mm128_store(&cblock1->w64[2], cval[1]);
  mm128_store(&cblock2->w64[0], cval[2]);
  mm128_store(&cblock2->w64[2], cval[3]);
  mm128_store(&cblock3->w64[0], cval[4]);
  mm128_store(&cblock3->w64[2], cval[5]);
  mm128_store(&cblock4->w64[0], cval[6]);
  mm128_store(&cblock4->w64[2], cval[7]);
}